

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O2

void __thiscall
tinyusdz::MetaVariable::MetaVariable<std::__cxx11::string>
          (MetaVariable *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *v)

{
  (this->_value).v_.vtable = (vtable_type *)linb::any::vtable_for_type<decltype(nullptr)>()::table;
  (this->_value).v_.storage.dynamic = (void *)0x0;
  (this->_name)._M_dataplus._M_p = (pointer)&(this->_name).field_2;
  (this->_name)._M_string_length = 0;
  (this->_name).field_2._M_local_buf[0] = '\0';
  set_value<std::__cxx11::string>(this,v);
  return;
}

Assistant:

MetaVariable(const T &v) {
    set_value(v);
  }